

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

void ClearHuffmanTreeIfOnlyOneSymbol(HuffmanTreeCode *huffman_code)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = huffman_code->num_symbols;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  bVar1 = false;
  while( true ) {
    if (uVar6 == uVar4) {
      for (lVar5 = 0; lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
        huffman_code->code_lengths[lVar5] = '\0';
        huffman_code->codes[lVar5] = 0;
        uVar3 = huffman_code->num_symbols;
      }
      return;
    }
    bVar2 = bVar1;
    if ((huffman_code->code_lengths[uVar4] != '\0') && (bVar2 = true, bVar1)) break;
    bVar1 = bVar2;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

static void ClearHuffmanTreeIfOnlyOneSymbol(
    HuffmanTreeCode* const huffman_code) {
  int k;
  int count = 0;
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    if (huffman_code->code_lengths[k] != 0) {
      ++count;
      if (count > 1) return;
    }
  }
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    huffman_code->code_lengths[k] = 0;
    huffman_code->codes[k] = 0;
  }
}